

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

void __thiscall flatbuffers::ToStringVisitor::StartVector(ToStringVisitor *this)

{
  ToStringVisitor *this_local;
  
  std::__cxx11::string::operator+=((string *)&this->s,"[");
  if ((this->vector_delimited & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)&this->s," ");
  }
  else {
    std::__cxx11::string::operator+=((string *)&this->s,(string *)&this->d);
    this->indent_level = this->indent_level + 1;
    append_indent(this);
  }
  return;
}

Assistant:

void StartVector() {
    s += "[";
    if (vector_delimited) {
      s += d;
      indent_level++;
      append_indent();
    } else {
      s += " ";
    }
  }